

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O0

bool dxil_spv::emit_msad_instruction(Impl *impl,CallInst *instruction)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  Id IVar1;
  Id type_id;
  Id IVar2;
  Builder *this;
  Operation *pOVar3;
  Value *pVVar4;
  Operation *pOVar5;
  reference pvVar6;
  Operation *pOVar7;
  Operation *this_00;
  Operation *add_op;
  Operation *add_op_1;
  Operation *extract_op;
  uint32_t i_3;
  Id sum_id;
  Operation *masked_diff_op;
  Operation *abs_diff_op;
  Operation *ref_src_diff_op;
  Operation *compare_ref_zero_op;
  Id zero_vector;
  uint32_t i_2;
  Operation *src_composite_op;
  uint32_t i_1;
  Operation *ref_composite_op;
  Operation *src_bfe_op;
  Operation *ref_bfe_op;
  uint32_t i;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  iterator local_98;
  undefined8 local_90;
  undefined1 local_88 [8];
  Vector<spv::Id> src_byte_ids;
  uint local_68 [4];
  iterator local_58;
  undefined8 local_50;
  undefined1 local_48 [8];
  Vector<spv::Id> ref_byte_ids;
  Id bool_type;
  Id uint32_vector_type;
  Id uint32_scalar_type;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  
  this = Converter::Impl::builder(impl);
  if (impl->glsl_std450_ext == 0) {
    IVar1 = spv::Builder::import(this,"GLSL.std.450");
    impl->glsl_std450_ext = IVar1;
  }
  IVar1 = spv::Builder::makeUintType(this,0x20);
  type_id = spv::Builder::makeVectorType(this,IVar1,4);
  IVar2 = spv::Builder::makeBoolType(this);
  ref_byte_ids.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       spv::Builder::makeVectorType(this,IVar2,4);
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_58 = local_68;
  local_50 = 4;
  __l_00._M_len = 4;
  __l_00._M_array = local_58;
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_48,__l_00,
             (allocator_type *)
             ((long)&src_byte_ids.
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  i = 0;
  local_a4 = 0;
  local_a0 = 0;
  local_9c = 0;
  local_98 = &i;
  local_90 = 4;
  __l._M_len = 4;
  __l._M_array = local_98;
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_88,__l,
             (allocator_type *)((long)&ref_bfe_op + 7));
  for (ref_bfe_op._0_4_ = 0; (uint)ref_bfe_op < 4; ref_bfe_op._0_4_ = (uint)ref_bfe_op + 1) {
    pOVar3 = Converter::Impl::allocate(impl,OpBitFieldUExtract,IVar1);
    pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    IVar2 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
    Operation::add_id(pOVar3,IVar2);
    IVar2 = spv::Builder::makeUintConstant(this,(uint)ref_bfe_op << 3,false);
    Operation::add_id(pOVar3,IVar2);
    IVar2 = spv::Builder::makeUintConstant(this,8,false);
    Operation::add_id(pOVar3,IVar2);
    Converter::Impl::add(impl,pOVar3,false);
    pOVar5 = Converter::Impl::allocate(impl,OpBitFieldUExtract,IVar1);
    pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
    IVar2 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
    Operation::add_id(pOVar5,IVar2);
    IVar2 = spv::Builder::makeUintConstant(this,(uint)ref_bfe_op << 3,false);
    Operation::add_id(pOVar5,IVar2);
    IVar2 = spv::Builder::makeUintConstant(this,8,false);
    Operation::add_id(pOVar5,IVar2);
    Converter::Impl::add(impl,pOVar5,false);
    IVar2 = pOVar3->id;
    pvVar6 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                        local_48,(ulong)(uint)ref_bfe_op);
    *pvVar6 = IVar2;
    IVar2 = pOVar5->id;
    pvVar6 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                        local_88,(ulong)(uint)ref_bfe_op);
    *pvVar6 = IVar2;
  }
  pOVar3 = Converter::Impl::allocate(impl,OpCompositeConstruct,type_id);
  for (src_composite_op._4_4_ = 0; src_composite_op._4_4_ < 4;
      src_composite_op._4_4_ = src_composite_op._4_4_ + 1) {
    pvVar6 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                        local_48,(ulong)src_composite_op._4_4_);
    Operation::add_id(pOVar3,*pvVar6);
  }
  Converter::Impl::add(impl,pOVar3,false);
  pOVar5 = Converter::Impl::allocate(impl,OpCompositeConstruct,type_id);
  for (compare_ref_zero_op._4_4_ = 0; compare_ref_zero_op._4_4_ < 4;
      compare_ref_zero_op._4_4_ = compare_ref_zero_op._4_4_ + 1) {
    pvVar6 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                        local_88,(ulong)compare_ref_zero_op._4_4_);
    Operation::add_id(pOVar5,*pvVar6);
  }
  Converter::Impl::add(impl,pOVar5,false);
  IVar2 = spv::Builder::makeNullConstant(this,type_id);
  pOVar7 = Converter::Impl::allocate
                     (impl,OpIEqual,
                      ref_byte_ids.
                      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  Operation::add_id(pOVar7,pOVar3->id);
  Operation::add_id(pOVar7,IVar2);
  Converter::Impl::add(impl,pOVar7,false);
  this_00 = Converter::Impl::allocate(impl,OpISub,type_id);
  Operation::add_id(this_00,pOVar3->id);
  Operation::add_id(this_00,pOVar5->id);
  Converter::Impl::add(impl,this_00,false);
  pOVar3 = Converter::Impl::allocate(impl,OpExtInst,type_id);
  Operation::add_id(pOVar3,impl->glsl_std450_ext);
  Operation::add_literal(pOVar3,5);
  Operation::add_id(pOVar3,this_00->id);
  Converter::Impl::add(impl,pOVar3,false);
  pOVar5 = Converter::Impl::allocate(impl,OpSelect,type_id);
  Operation::add_id(pOVar5,pOVar7->id);
  Operation::add_id(pOVar5,IVar2);
  Operation::add_id(pOVar5,pOVar3->id);
  Converter::Impl::add(impl,pOVar5,false);
  extract_op._4_4_ = 0;
  for (extract_op._0_4_ = 0; (uint)extract_op < 4; extract_op._0_4_ = (uint)extract_op + 1) {
    pOVar3 = Converter::Impl::allocate(impl,OpCompositeExtract,IVar1);
    Operation::add_id(pOVar3,pOVar5->id);
    Operation::add_literal(pOVar3,(uint)extract_op);
    Converter::Impl::add(impl,pOVar3,false);
    if (extract_op._4_4_ == 0) {
      extract_op._4_4_ = pOVar3->id;
    }
    else {
      pOVar7 = Converter::Impl::allocate(impl,OpIAdd,IVar1);
      Operation::add_id(pOVar7,extract_op._4_4_);
      Operation::add_id(pOVar7,pOVar3->id);
      Converter::Impl::add(impl,pOVar7,false);
      extract_op._4_4_ = pOVar7->id;
    }
  }
  pOVar3 = Converter::Impl::allocate(impl,OpIAdd,(Value *)instruction);
  pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,3);
  IVar1 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
  Operation::add_id(pOVar3,IVar1);
  Operation::add_id(pOVar3,extract_op._4_4_);
  Converter::Impl::add(impl,pOVar3,false);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_88);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_48);
  return true;
}

Assistant:

bool emit_msad_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	if (!impl.glsl_std450_ext)
		impl.glsl_std450_ext = builder.import("GLSL.std.450");

	// Don't modify this implementation since compilers pattern match this.

	spv::Id uint32_scalar_type = builder.makeUintType(32);
	spv::Id uint32_vector_type = builder.makeVectorType(uint32_scalar_type, 4);
	spv::Id bool_type = builder.makeVectorType(builder.makeBoolType(), 4);

	Vector<spv::Id> ref_byte_ids = { 0, 0, 0, 0 };
	Vector<spv::Id> src_byte_ids = { 0, 0, 0, 0 };

	for (uint32_t i = 0; i < 4; i++)
	{
		auto *ref_bfe_op = impl.allocate(spv::OpBitFieldUExtract, uint32_scalar_type);
		ref_bfe_op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
		ref_bfe_op->add_id(builder.makeUintConstant(8 * i));
		ref_bfe_op->add_id(builder.makeUintConstant(8));
		impl.add(ref_bfe_op);

		auto *src_bfe_op = impl.allocate(spv::OpBitFieldUExtract, uint32_scalar_type);
		src_bfe_op->add_id(impl.get_id_for_value(instruction->getOperand(2)));
		src_bfe_op->add_id(builder.makeUintConstant(8 * i));
		src_bfe_op->add_id(builder.makeUintConstant(8));
		impl.add(src_bfe_op);

		ref_byte_ids[i] = ref_bfe_op->id;
		src_byte_ids[i] = src_bfe_op->id;
	}

	auto *ref_composite_op = impl.allocate(spv::OpCompositeConstruct, uint32_vector_type);
	for (uint32_t i = 0; i < 4; i++)
		ref_composite_op->add_id(ref_byte_ids[i]);
	impl.add(ref_composite_op);

	auto *src_composite_op = impl.allocate(spv::OpCompositeConstruct, uint32_vector_type);
	for (uint32_t i = 0; i < 4; i++)
		src_composite_op->add_id(src_byte_ids[i]);
	impl.add(src_composite_op);

	spv::Id zero_vector = builder.makeNullConstant(uint32_vector_type);

	auto *compare_ref_zero_op = impl.allocate(spv::OpIEqual, bool_type);
	compare_ref_zero_op->add_id(ref_composite_op->id);
	compare_ref_zero_op->add_id(zero_vector);
	impl.add(compare_ref_zero_op);

	auto *ref_src_diff_op = impl.allocate(spv::OpISub, uint32_vector_type);
	ref_src_diff_op->add_id(ref_composite_op->id);
	ref_src_diff_op->add_id(src_composite_op->id);
	impl.add(ref_src_diff_op);

	auto *abs_diff_op = impl.allocate(spv::OpExtInst, uint32_vector_type);
	abs_diff_op->add_id(impl.glsl_std450_ext);
	abs_diff_op->add_literal(GLSLstd450SAbs);
	abs_diff_op->add_id(ref_src_diff_op->id);
	impl.add(abs_diff_op);

	auto *masked_diff_op = impl.allocate(spv::OpSelect, uint32_vector_type);
	masked_diff_op->add_id(compare_ref_zero_op->id);
	masked_diff_op->add_id(zero_vector);
	masked_diff_op->add_id(abs_diff_op->id);
	impl.add(masked_diff_op);

	spv::Id sum_id = 0;

	for (uint32_t i = 0; i < 4; i++)
	{
		auto *extract_op = impl.allocate(spv::OpCompositeExtract, uint32_scalar_type);
		extract_op->add_id(masked_diff_op->id);
		extract_op->add_literal(i);
		impl.add(extract_op);

		if (sum_id)
		{
			auto *add_op = impl.allocate(spv::OpIAdd, uint32_scalar_type);
			add_op->add_id(sum_id);
			add_op->add_id(extract_op->id);
			impl.add(add_op);

			sum_id = add_op->id;
		}
		else
			sum_id = extract_op->id;
	}

	/* DXIL docs say that the addition should saturate on overflow,
	 * but but drivers don't seem to do that. */
	auto *add_op = impl.allocate(spv::OpIAdd, instruction);
	add_op->add_id(impl.get_id_for_value(instruction->getOperand(3)));
	add_op->add_id(sum_id);
	impl.add(add_op);

	return true;
}